

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_layer_interface.cpp
# Opt level: O0

XrResult ApiLayerInterface::GetApiLayerProperties
                   (string *openxr_command,uint32_t incoming_count,uint32_t *outgoing_count,
                   XrApiLayerProperties *api_layer_properties)

{
  size_type sVar1;
  reference this;
  pointer this_00;
  uint local_28c;
  undefined1 auStack_288 [4];
  uint32_t prop;
  pointer pXStack_280;
  pointer local_278;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_218;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_1a8;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_138;
  allocator local_119;
  string local_118;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_f8;
  allocator local_d1;
  string local_d0;
  XrResult local_b0;
  undefined4 local_ac;
  XrResult result;
  pointer pXStack_a0;
  pointer local_98;
  allocator local_71;
  string local_70;
  uint local_50;
  uint local_4c;
  uint32_t i;
  uint32_t manifest_count;
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  manifest_files;
  XrApiLayerProperties *api_layer_properties_local;
  uint32_t *outgoing_count_local;
  uint32_t incoming_count_local;
  string *openxr_command_local;
  
  manifest_files.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)api_layer_properties;
  std::
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ::vector((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
            *)&i);
  local_4c = 0;
  if ((incoming_count != 0) &&
     (manifest_files.
      super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0)) {
    for (local_50 = 0; local_50 < incoming_count; local_50 = local_50 + 1) {
      if (*(int *)&manifest_files.
                   super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage[(ulong)local_50 * 0x44]._M_t.
                   super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                   .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>._M_head_impl != 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_70,
                   "VUID-XrApiLayerProperties-type-type: unknown type in api_layer_properties",
                   &local_71);
        _result = (pointer)0x0;
        pXStack_a0 = (pointer)0x0;
        local_98 = (pointer)0x0;
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector
                  ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&result);
        LoaderLogger::LogErrorMessage
                  (openxr_command,&local_70,
                   (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&result);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                  ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&result);
        std::__cxx11::string::~string((string *)&local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
        openxr_command_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        goto LAB_001076cf;
      }
    }
  }
  if (outgoing_count == (uint32_t *)0x0) {
    openxr_command_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    local_b0 = ApiLayerManifestFile::FindManifestFiles
                         (openxr_command,MANIFEST_TYPE_IMPLICIT_API_LAYER,
                          (vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                           *)&i);
    if (XR_ERROR_VALIDATION_FAILURE < local_b0) {
      local_b0 = ApiLayerManifestFile::FindManifestFiles
                           (openxr_command,MANIFEST_TYPE_EXPLICIT_API_LAYER,
                            (vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                             *)&i);
    }
    if (local_b0 < XR_SUCCESS) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_d0,
                 "ApiLayerInterface::GetApiLayerProperties - failed searching for API layer manifest files"
                 ,&local_d1);
      local_f8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_f8);
      LoaderLogger::LogErrorMessage(openxr_command,&local_d0,&local_f8);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_f8);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      openxr_command_local._4_4_ = local_b0;
    }
    else {
      sVar1 = std::
              vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
              ::size((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                      *)&i);
      if (sVar1 < 0xffffffff) {
        sVar1 = std::
                vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                ::size((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                        *)&i);
        local_4c = (uint)sVar1;
        if (outgoing_count == (uint32_t *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_158,"xrEnumerateInstanceExtensionProperties",&local_159);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_180,
                     "VUID-xrEnumerateApiLayerProperties-propertyCountOutput-parameter: null propertyCountOutput"
                     ,&local_181);
          local_1a8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1a8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1a8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_1a8);
          LoaderLogger::LogErrorMessage(&local_158,&local_180,&local_1a8);
          std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_1a8);
          std::__cxx11::string::~string((string *)&local_180);
          std::allocator<char>::~allocator((allocator<char> *)&local_181);
          std::__cxx11::string::~string((string *)&local_158);
          std::allocator<char>::~allocator((allocator<char> *)&local_159);
          openxr_command_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        }
        else {
          *outgoing_count = local_4c;
          if (incoming_count == 0) {
            openxr_command_local._4_4_ = XR_SUCCESS;
          }
          else if (manifest_files.
                   super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_1c8,"xrEnumerateInstanceExtensionProperties",&local_1c9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_1f0,
                       "VUID-xrEnumerateApiLayerProperties-properties-parameter: non-zero capacity but null array"
                       ,&local_1f1);
            local_218.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_218.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_218.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_218)
            ;
            LoaderLogger::LogErrorMessage(&local_1c8,&local_1f0,&local_218);
            std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                      (&local_218);
            std::__cxx11::string::~string((string *)&local_1f0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
            openxr_command_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          }
          else if (incoming_count < local_4c) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_238,"xrEnumerateInstanceExtensionProperties",&local_239);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_260,
                       "VUID-xrEnumerateApiLayerProperties-propertyCapacityInput-parameter: insufficient space in array"
                       ,&local_261);
            _auStack_288 = (pointer)0x0;
            pXStack_280 = (pointer)0x0;
            local_278 = (pointer)0x0;
            std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector
                      ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                       auStack_288);
            LoaderLogger::LogErrorMessage
                      (&local_238,&local_260,
                       (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                       auStack_288);
            std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                      ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                       auStack_288);
            std::__cxx11::string::~string((string *)&local_260);
            std::allocator<char>::~allocator((allocator<char> *)&local_261);
            std::__cxx11::string::~string((string *)&local_238);
            std::allocator<char>::~allocator((allocator<char> *)&local_239);
            openxr_command_local._4_4_ = XR_ERROR_SIZE_INSUFFICIENT;
          }
          else {
            for (local_28c = 0; local_28c < incoming_count && local_28c < local_4c;
                local_28c = local_28c + 1) {
              this = std::
                     vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                     ::operator[]((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                                   *)&i,(ulong)local_28c);
              this_00 = std::
                        unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                        ::operator->(this);
              ApiLayerManifestFile::PopulateApiLayerProperties
                        (this_00,(XrApiLayerProperties *)
                                 (manifest_files.
                                  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                 (ulong)local_28c * 0x44));
            }
            openxr_command_local._4_4_ = XR_SUCCESS;
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_118,
                   "ApiLayerInterface::GetApiLayerProperties - too many API layers found",&local_119
                  );
        local_138.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_138.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_138.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_138);
        LoaderLogger::LogErrorMessage(openxr_command,&local_118,&local_138);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_138);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
        openxr_command_local._4_4_ = XR_ERROR_RUNTIME_FAILURE;
      }
    }
  }
LAB_001076cf:
  local_ac = 1;
  std::
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ::~vector((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
             *)&i);
  return openxr_command_local._4_4_;
}

Assistant:

XrResult ApiLayerInterface::GetApiLayerProperties(const std::string& openxr_command, uint32_t incoming_count,
                                                  uint32_t* outgoing_count, XrApiLayerProperties* api_layer_properties) {
    std::vector<std::unique_ptr<ApiLayerManifestFile>> manifest_files;
    uint32_t manifest_count = 0;
    // Validate props struct before proceeding
    if (0 < incoming_count && nullptr != api_layer_properties) {
        for (uint32_t i = 0; i < incoming_count; i++) {
            if (XR_TYPE_API_LAYER_PROPERTIES != api_layer_properties[i].type) {
                LoaderLogger::LogErrorMessage(openxr_command,
                                              "VUID-XrApiLayerProperties-type-type: unknown type in api_layer_properties");
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }

    // "Independent of elementCapacityInput or elements parameters, elementCountOutput must be a valid pointer,
    // and the function sets elementCountOutput." - 2.11
    if (nullptr == outgoing_count) {
        return XR_ERROR_VALIDATION_FAILURE;
    }

    // Find any implicit layers which we may need to report information for.
    XrResult result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_IMPLICIT_API_LAYER, manifest_files);
    if (XR_SUCCEEDED(result)) {
        // Find any explicit layers which we may need to report information for.
        result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_EXPLICIT_API_LAYER, manifest_files);
    }
    if (XR_FAILED(result)) {
        LoaderLogger::LogErrorMessage(openxr_command,
                                      "ApiLayerInterface::GetApiLayerProperties - failed searching for API layer manifest files");
        return result;
    }

    // check for potential overflow before static_cast<uint32_t>
    if (manifest_files.size() >= UINT32_MAX) {
        LoaderLogger::LogErrorMessage(openxr_command, "ApiLayerInterface::GetApiLayerProperties - too many API layers found");
        return XR_ERROR_RUNTIME_FAILURE;
    }

    manifest_count = static_cast<uint32_t>(manifest_files.size());
    if (nullptr == outgoing_count) {
        LoaderLogger::LogErrorMessage("xrEnumerateInstanceExtensionProperties",
                                      "VUID-xrEnumerateApiLayerProperties-propertyCountOutput-parameter: null propertyCountOutput");
        return XR_ERROR_VALIDATION_FAILURE;
    }

    *outgoing_count = manifest_count;
    if (0 == incoming_count) {
        // capacity check only
        return XR_SUCCESS;
    }
    if (nullptr == api_layer_properties) {
        // incoming_count is not 0 BUT the api_layer_properties is NULL
        LoaderLogger::LogErrorMessage("xrEnumerateInstanceExtensionProperties",
                                      "VUID-xrEnumerateApiLayerProperties-properties-parameter: non-zero capacity but null array");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (incoming_count < manifest_count) {
        LoaderLogger::LogErrorMessage(
            "xrEnumerateInstanceExtensionProperties",
            "VUID-xrEnumerateApiLayerProperties-propertyCapacityInput-parameter: insufficient space in array");
        return XR_ERROR_SIZE_INSUFFICIENT;
    }

    for (uint32_t prop = 0; prop < incoming_count && prop < manifest_count; ++prop) {
        manifest_files[prop]->PopulateApiLayerProperties(api_layer_properties[prop]);
    }
    return XR_SUCCESS;
}